

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_service_handler.c
# Opt level: O0

int csp_cmp_handler(csp_packet_t *packet)

{
  csp_cmp_message *cmp_00;
  csp_cmp_message *cmp_01;
  long in_RDI;
  csp_cmp_message *cmp;
  int ret;
  int local_14;
  int local_4;
  
  cmp_00 = (csp_cmp_message *)(in_RDI + 0x40);
  if (cmp_00->type == '\0') {
    cmp_01 = (csp_cmp_message *)(ulong)(*(byte *)(in_RDI + 0x41) - 1);
    switch(cmp_01) {
    case (csp_cmp_message *)0x0:
      local_14 = do_cmp_ident((csp_cmp_message *)0x10aee1);
      *(undefined2 *)(in_RDI + 0x20) = 0x5d;
      break;
    case (csp_cmp_message *)0x1:
      local_14 = do_cmp_route_set_v1(cmp_01);
      *(undefined2 *)(in_RDI + 0x20) = 0xf;
      break;
    case (csp_cmp_message *)0x2:
      local_14 = do_cmp_if_stats(cmp_01);
      *(undefined2 *)(in_RDI + 0x20) = 0x35;
      break;
    case (csp_cmp_message *)0x3:
      local_14 = do_cmp_peek(cmp_01);
      break;
    case (csp_cmp_message *)0x4:
      local_14 = do_cmp_poke(cmp_01);
      break;
    case (csp_cmp_message *)0x5:
      local_14 = do_cmp_clock(cmp_00);
      break;
    case (csp_cmp_message *)0x6:
      local_14 = do_cmp_route_set_v2(cmp_01);
      *(undefined2 *)(in_RDI + 0x20) = 0x14;
      break;
    case (csp_cmp_message *)0x7:
      local_14 = do_cmp_peek_v2(cmp_01);
      break;
    case (csp_cmp_message *)0x8:
      local_14 = do_cmp_poke_v2(cmp_01);
      break;
    default:
      local_14 = -2;
    }
    cmp_00->type = 0xff;
    local_4 = local_14;
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

static int csp_cmp_handler(csp_packet_t * packet) {

	int ret = CSP_ERR_INVAL;
	struct csp_cmp_message * cmp = (struct csp_cmp_message *)packet->data;

	/* Ignore everything but requests */
	if (cmp->type != CSP_CMP_REQUEST)
		return ret;

	switch (cmp->code) {
		case CSP_CMP_IDENT:
			ret = do_cmp_ident(cmp);
			packet->length = CMP_SIZE(ident);
			break;

		case CSP_CMP_ROUTE_SET_V1:
			ret = do_cmp_route_set_v1(cmp);
			packet->length = CMP_SIZE(route_set_v1);
			break;

		case CSP_CMP_ROUTE_SET_V2:
			ret = do_cmp_route_set_v2(cmp);
			packet->length = CMP_SIZE(route_set_v2);
			break;

		case CSP_CMP_IF_STATS:
			ret = do_cmp_if_stats(cmp);
			packet->length = CMP_SIZE(if_stats);
			break;

		case CSP_CMP_PEEK:
			ret = do_cmp_peek(cmp);
			break;

		case CSP_CMP_POKE:
			ret = do_cmp_poke(cmp);
			break;

		case CSP_CMP_PEEK_V2:
			ret = do_cmp_peek_v2(cmp);
			break;

		case CSP_CMP_POKE_V2:
			ret = do_cmp_poke_v2(cmp);
			break;

		case CSP_CMP_CLOCK:
			ret = do_cmp_clock(cmp);
			break;

		default:
			ret = CSP_ERR_INVAL;
			break;
	}

	cmp->type = CSP_CMP_REPLY;

	return ret;
}